

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinerama.c
# Opt level: O2

_Bool xinerama_is_active(xcb_connection_t *connection)

{
  undefined4 uVar1;
  void *__ptr;
  _Bool _Var2;
  long local_20;
  xcb_generic_error_t *err;
  
  local_20 = 0;
  uVar1 = xcb_xinerama_is_active(connection);
  __ptr = (void *)xcb_xinerama_is_active_reply(connection,uVar1,&local_20);
  if (local_20 == 0) {
    _Var2 = *(int *)((long)__ptr + 8) != 0;
  }
  else {
    _Var2 = false;
  }
  free(__ptr);
  return _Var2;
}

Assistant:

bool xinerama_is_active(xcb_connection_t *connection)
{
        xcb_generic_error_t *err = XCB_NONE;

        xcb_xinerama_is_active_cookie_t is_active_cookie = xcb_xinerama_is_active(connection);
        xcb_xinerama_is_active_reply_t *is_active_reply
                = xcb_xinerama_is_active_reply(connection, is_active_cookie, &err);

        if (err != XCB_NONE) {
                free(is_active_reply);

                return false;
        }

        bool is_active = (bool)is_active_reply->state;

        free(is_active_reply);

        return is_active;
}